

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

void CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex,ActionUnserialize>
               (long param_1,uint *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  int _nVersion;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock0;
  DataStream *in_stack_ffffffffffffff08;
  uint *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff08);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff28 >> 0x18,0));
  Using<VarIntFormatter<(VarIntMode)1>,int&>((int *)in_stack_ffffffffffffff10);
  ActionUnserialize::SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)1>,int&>>
            (in_stack_ffffffffffffff08,(Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)0x39c2ba);
  Using<VarIntFormatter<(VarIntMode)1>,int&>((int *)in_stack_ffffffffffffff10);
  ActionUnserialize::SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)1>,int&>>
            (in_stack_ffffffffffffff08,(Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)0x39c300);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>(in_stack_ffffffffffffff10);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff08,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x39c346);
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>(in_stack_ffffffffffffff10);
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (in_stack_ffffffffffffff08,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x39c38c);
  if ((*(uint *)(param_1 + 0x58) & 0x18) != 0) {
    Using<VarIntFormatter<(VarIntMode)1>,int&>((int *)in_stack_ffffffffffffff10);
    ActionUnserialize::SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)1>,int&>>
              (in_stack_ffffffffffffff08,(Wrapper<VarIntFormatter<(VarIntMode)1>,_int_&> *)0x39c3e5)
    ;
  }
  if ((*(uint *)(param_1 + 0x58) & 8) != 0) {
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>(in_stack_ffffffffffffff10);
    ActionUnserialize::
    SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
              (in_stack_ffffffffffffff08,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x39c467);
  }
  if ((*(uint *)(param_1 + 0x58) & 0x10) != 0) {
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>(param_2);
    ActionUnserialize::
    SerReadWriteMany<DataStream,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
              (in_stack_ffffffffffffff08,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x39c4c2);
  }
  ActionUnserialize::SerReadWriteMany<DataStream,int&>(in_stack_ffffffffffffff08,(int *)0x39c4df);
  ActionUnserialize::SerReadWriteMany<DataStream,uint256&>
            (in_stack_ffffffffffffff08,(uint256 *)0x39c4fd);
  ActionUnserialize::SerReadWriteMany<DataStream,uint256&>
            (in_stack_ffffffffffffff08,(uint256 *)0x39c518);
  ActionUnserialize::SerReadWriteMany<DataStream,unsigned_int&>
            (in_stack_ffffffffffffff08,(uint *)0x39c533);
  ActionUnserialize::SerReadWriteMany<DataStream,unsigned_int&>
            (in_stack_ffffffffffffff08,(uint *)0x39c551);
  ActionUnserialize::SerReadWriteMany<DataStream,unsigned_int&>
            (in_stack_ffffffffffffff08,(uint *)0x39c56f);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CDiskBlockIndex, obj)
    {
        LOCK(::cs_main);
        int _nVersion = DUMMY_VERSION;
        READWRITE(VARINT_MODE(_nVersion, VarIntMode::NONNEGATIVE_SIGNED));

        READWRITE(VARINT_MODE(obj.nHeight, VarIntMode::NONNEGATIVE_SIGNED));
        READWRITE(VARINT(obj.nStatus));
        READWRITE(VARINT(obj.nTx));
        if (obj.nStatus & (BLOCK_HAVE_DATA | BLOCK_HAVE_UNDO)) READWRITE(VARINT_MODE(obj.nFile, VarIntMode::NONNEGATIVE_SIGNED));
        if (obj.nStatus & BLOCK_HAVE_DATA) READWRITE(VARINT(obj.nDataPos));
        if (obj.nStatus & BLOCK_HAVE_UNDO) READWRITE(VARINT(obj.nUndoPos));

        // block header
        READWRITE(obj.nVersion);
        READWRITE(obj.hashPrev);
        READWRITE(obj.hashMerkleRoot);
        READWRITE(obj.nTime);
        READWRITE(obj.nBits);
        READWRITE(obj.nNonce);
    }